

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7_helpers.c
# Opt level: O2

int GmfReadBoundaryPolygons(PolMshSct *pol)

{
  int32_t (*paiVar1) [2];
  int iVar2;
  uint uVar3;
  undefined8 in_stack_ffffffffffffffd8;
  int32_t (*paiVar4) [2];
  
  uVar3 = 0;
  if (((pol != (PolMshSct *)0x0) && (paiVar1 = pol->BndHdrTab, paiVar1 != (int32_t (*) [2])0x0)) &&
     (pol->BndVerTab != (int32_t *)0x0)) {
    paiVar4 = paiVar1 + pol->NmbBndHdr;
    uVar3 = 0;
    iVar2 = GmfGetBlock(pol->MshIdx,0xcb,1,(long)pol->NmbBndHdr,0,(void *)0x0,(void *)0x0,0xe,
                        CONCAT44((int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),2),paiVar1 + 1,
                        paiVar4);
    if (iVar2 != 0) {
      iVar2 = GmfGetBlock(pol->MshIdx,0xcc,1,(long)pol->NmbBndVer,0,(void *)0x0,(void *)0x0,10,
                          pol->BndVerTab + 1,pol->BndVerTab + pol->NmbBndVer,paiVar4);
      uVar3 = (uint)(iVar2 != 0);
    }
  }
  return uVar3;
}

Assistant:

int GmfReadBoundaryPolygons(PolMshSct *pol)
{
   int ret;

   if (!pol || !pol->BndHdrTab || !pol->BndVerTab)
      return (0);

   ret = GmfGetBlock(pol->MshIdx, GmfBoundaryPolygonHeaders,
                     1, pol->NmbBndHdr, 0, NULL, NULL, GmfIntVec, 2,
                     pol->BndHdrTab[1], pol->BndHdrTab[pol->NmbBndHdr]);

   if (!ret)
      return (0);

   ret = GmfGetBlock(pol->MshIdx, GmfBoundaryPolygonVertices,
                     1, pol->NmbBndVer, 0, NULL, NULL, GmfInt,
                     &pol->BndVerTab[1], &pol->BndVerTab[pol->NmbBndVer]);

   if (!ret)
      return (0);

   return (1);
}